

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.c
# Opt level: O1

Integer pnga_type_c2f(Integer type)

{
  if ((type - 0x3e9U < 0x10) && ((0x806fU >> ((uint)(type - 0x3e9U) & 0x1f) & 1) != 0)) {
    type = *(Integer *)
            (
            "void dot_range_(Integer *, Integer *, Integer *, Integer *, Integer *, Integer *, Integer *)"
            + type * 8 + 0x37);
  }
  return type;
}

Assistant:

Integer pnga_type_c2f(Integer type)
{
Integer ftype;
   switch(type){
   case C_INT: 
                ftype = (sizeof(int) != sizeof(Integer))? -1: MT_F_INT;
                break;
   case C_LONG: 
                ftype = (sizeof(long) != sizeof(Integer))? -1: MT_F_INT;
                break;
   case C_LONGLONG: 
                ftype = (sizeof(long long) != sizeof(Integer))? -1: MT_F_INT;
                break;
   case C_FLOAT:
#       if   SIZEOF_FLOAT == SIZEOF_F77_REAL
                ftype = MT_F_REAL; 
#       elif SIZEOF_FLOAT == SIZEOF_F77_DOUBLE_PRECISION
                ftype = MT_F_DBL; 
#       else
                ftype = -1;
#       endif
                break;
   case C_DBL: 
                ftype = MT_F_DBL;
                break;
   case C_DCPL:
                ftype = MT_F_DCPL;
                break;
   case C_SCPL:
#       if   SIZEOF_FLOAT == SIZEOF_F77_REAL
                ftype = MT_F_SCPL;
#       elif SIZEOF_FLOAT == SIZEOF_F77_DOUBLE_PRECISION
                ftype = MT_F_DCPL;
#       else
                ftype = -1;
#       endif
                break;
   default:     ftype = type;
                break;
   }
   
   return(ftype);
}